

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE trap_errors(qpdf_data qpdf,function<void_(_qpdf_data_*)> *fn)

{
  QPDF_BOOL QVar1;
  QPDFExc *e;
  runtime_error *e_1;
  exception *e_2;
  uint local_1c;
  QPDF_ERROR_CODE status;
  function<void_(_qpdf_data_*)> *fn_local;
  qpdf_data qpdf_local;
  
  std::function<void_(_qpdf_data_*)>::operator()(fn,qpdf);
  QVar1 = qpdf_more_warnings(qpdf);
  local_1c = (uint)(QVar1 != 0);
  return local_1c;
}

Assistant:

static QPDF_ERROR_CODE
trap_errors(qpdf_data qpdf, std::function<void(qpdf_data)> fn)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    try {
        fn(qpdf);
    } catch (QPDFExc& e) {
        qpdf->error = std::make_shared<QPDFExc>(e);
        status |= QPDF_ERRORS;
    } catch (std::runtime_error& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_system, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    } catch (std::exception& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_internal, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    }

    if (qpdf_more_warnings(qpdf)) {
        status |= QPDF_WARNINGS;
    }
    return status;
}